

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workWithFilesAndCiphertext.h
# Opt level: O0

string * getBits_abi_cxx11_(string *__return_storage_ptr__,
                           vector<unsigned_int,_std::allocator<unsigned_int>_> *arr)

{
  bool bVar1;
  reference puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  bitset<32ul> local_48 [8];
  bitset<32UL> bits;
  const_iterator cStack_38;
  uint dword;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arr_local;
  string *arrBits;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(arr);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(arr);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    bits.super__Base_bitset<1UL>._M_w._4_4_ = *puVar2;
    std::bitset<32UL>::bitset
              ((bitset<32UL> *)local_48,(ulong)bits.super__Base_bitset<1UL>._M_w._4_4_);
    std::bitset<32ul>::to_string_abi_cxx11_(&local_68,local_48);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getBits(const std::vector<unsigned> &arr) {
    std::string arrBits;
    for (const auto dword : arr) {
        std::bitset<32> bits(dword);
        arrBits += bits.to_string();
    }

    return arrBits;
}